

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O0

void __thiscall lazyTrees::LazyKdTree<Point2D>::ensure_evaluated_fully(LazyKdTree<Point2D> *this)

{
  bool bVar1;
  LazyKdTree<Point2D> *in_RDI;
  LazyKdTree<Point2D> *in_stack_00000090;
  
  ensure_evaluated(in_stack_00000090);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                      *)0x1b1c16);
  if (bVar1) {
    std::
    unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
    ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                  *)0x1b1c2a);
    ensure_evaluated_fully(in_RDI);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                      *)0x1b1c40);
  if (bVar1) {
    std::
    unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
    ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                  *)0x1b1c54);
    ensure_evaluated_fully(in_RDI);
  }
  return;
}

Assistant:

void ensure_evaluated_fully()
    {
        ensure_evaluated();
        if (childNegative)
            childNegative->ensure_evaluated_fully();
        if (childPositive)
            childPositive->ensure_evaluated_fully();
    }